

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::draw_faces(Mesh *this,bool smooth)

{
  Face *this_00;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *plVar1;
  Scene *pSVar2;
  DrawStyle *pDVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  Vector3D N;
  GLfloat white [4];
  Vector3D normal;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Vector3D local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Vector3D local_48;
  
  local_58 = 0x3f800000;
  uStack_54 = 0x3f800000;
  uStack_50 = 0x3f800000;
  uStack_4c = 0x3f800000;
  local_88 = 0x3f800000;
  uStack_84 = 0x3f800000;
  uStack_80 = 0x3f800000;
  uStack_7c = 0x3f800000;
  if ((this->super_SceneObject).isGhosted == true) {
    local_88 = 0x3e800000;
    uStack_84 = 0x3e800000;
    uStack_80 = 0x3e800000;
    uStack_7c = 0x3e800000;
  }
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,&local_58);
  if (!smooth) {
    glMaterialfv(0x408,0x1201,&local_88);
  }
  plVar1 = &(this->mesh).faces;
  p_Var6 = (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)plVar1) {
    do {
      glEnable(0x8037);
      glPolygonOffset(0x3f800000,0x3f800000);
      this_00 = (Face *)(p_Var6 + 1);
      pSVar2 = (this->super_SceneObject).scene;
      if (pSVar2 == (Scene *)0x0) {
LAB_0016d3ef:
        lVar4 = 0x1d0;
      }
      else if ((Face *)(pSVar2->selected).element == this_00) {
        lVar4 = 0x1e0;
      }
      else {
        if ((Face *)(pSVar2->hovered).element != this_00) goto LAB_0016d3ef;
        lVar4 = 0x1d8;
      }
      pDVar3 = *(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar4);
      if ((!smooth) && (pDVar3 != this->defaultStyle)) {
        glDisable(0xb50);
        glColor4fv(&pDVar3->faceColor);
      }
      glBegin(9);
      Face::normal(&local_48,this_00);
      if (!smooth) {
        glNormal3dv(&local_48);
      }
      p_Var5 = p_Var6[0xb]._M_prev;
      do {
        if (smooth) {
          Vertex::normal(&local_70,(Vertex *)(p_Var5[2]._M_prev + 1));
          glNormal3d(SUB84(local_70.x,0),local_70.y,local_70.z);
        }
        glVertex3dv(&p_Var5[2]._M_prev[1]._M_prev);
        p_Var5 = p_Var5[2]._M_next;
      } while (p_Var5 != p_Var6[0xb]._M_prev);
      glEnd();
      if (pDVar3 != this->defaultStyle) {
        glEnable(0xb50);
      }
      p_Var6 = p_Var6->_M_next;
    } while (p_Var6 != (_List_node_base *)plVar1);
  }
  return;
}

Assistant:

void Mesh::draw_faces(bool smooth) const {

   GLfloat white[4] = { 1., 1., 1., 1. };
   GLfloat faceColor[4] = { 1., 1., 1., 1. };
   if (isGhosted)
   {
     faceColor[0] = faceColor[1] = faceColor[2] = faceColor[3] = 0.25;
   }
   glEnable( GL_LIGHTING );
   glEnable( GL_LIGHT0 );
   glLightfv( GL_LIGHT0, GL_DIFFUSE, white );
   if (!smooth) glMaterialfv( GL_FRONT_AND_BACK, GL_DIFFUSE, faceColor);

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {

    // Prevent z fighting (faces bleeding into edges and points).
    glEnable(GL_POLYGON_OFFSET_FILL);
    glPolygonOffset(1.0, 1.0);

    DrawStyle* style = get_draw_style(elementAddress(f));
    if (!smooth) {
      if (style != defaultStyle) {
        glDisable(GL_LIGHTING);
        style->style_face();
      }
    }

    glBegin(GL_POLYGON);
    Vector3D normal(f->normal());
    if (!smooth) glNormal3dv(&normal.x);
    HalfedgeCIter h = f->halfedge();
    do {
      if (smooth) {
        Vector3D N = h->vertex()->normal();
        glNormal3d(N.x, N.y, N.z);
      }
      glVertex3dv(&h->vertex()->position.x);
      h = h->next();
    } while (h != f->halfedge());
    glEnd();

    if (style != defaultStyle) {
      glEnable(GL_LIGHTING);
    }
  }
}